

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,1,1>::accumulateDerivativesImpl<false,true,false>
          (BeagleCPUImpl<double,1,1> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar3 = ZEXT816(0) << 0x40;
  for (uVar2 = 0; (~((int)*(uint *)(this + 0x14) >> 0x1f) & *(uint *)(this + 0x14)) != uVar2;
      uVar2 = uVar2 + 1) {
    auVar4._0_8_ = *(double *)(*(long *)(this + 0x100) + uVar2 * 8) /
                   *(double *)(*(long *)(this + 0xf8) + uVar2 * 8);
    auVar4._8_8_ = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(*(long *)(this + 0x80) + uVar2 * 8);
    auVar3 = vfmadd231sd_fma(auVar3,auVar4,auVar1);
  }
  *outSumDerivatives = auVar3._0_8_;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}